

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int planandnavigatexythetalat
              (PlannerType plannerType,char *envCfgFilename,char *motPrimFilename,bool forwardSearch
              )

{
  undefined8 uVar1;
  bool bVar2;
  EnvNAVXYTHETALAT_InitParms EVar3;
  FILE *pFVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  undefined8 uVar8;
  ARAPlanner *this;
  ADPlanner *this_00;
  anaPlanner *this_01;
  size_type sVar9;
  ostream *poVar10;
  reference pvVar11;
  clock_t cVar12;
  ulong uVar13;
  reference pvVar14;
  uint *puVar15;
  byte in_CL;
  undefined4 in_EDI;
  undefined4 uVar16;
  double dVar17;
  int newstartstateID;
  int newtheta_2;
  int newy_2;
  int newx_2;
  int newtheta_1;
  int newy_1;
  int newx_1;
  int j_1;
  bool bOnthePath;
  int cost;
  int index_1;
  int x_3;
  int y_3;
  int goalindex;
  int startindex;
  int newtheta;
  int newy;
  int newx;
  int j;
  uint i_3;
  bool bPlanExists;
  int starttheta_c;
  int starty_c;
  int startx_c;
  double TimeStarted;
  uchar truecost;
  int index;
  int y_2;
  int x_2;
  int i_2;
  bool bChanges;
  vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> xythetaPath;
  sbpl_2Dcell_t nav2dcell;
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> changedcellsV;
  vector<int,_std::allocator<int>_> preds_of_changededgesIDV;
  int goaltheta_c;
  int goaly_c;
  int goalx_c;
  FILE *fSol;
  char *sol;
  int y_1;
  int x_1;
  int sensingRange;
  int dy;
  int dx;
  SBPL_xytheta_mprimitive *mprim;
  int i_1;
  EnvNAVXYTHETALATConfig_t *cfg;
  double maxMotPrimLength;
  double maxMotPrimLengthSquared;
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> sensecells;
  SBPLPlanner *planner;
  vector<int,_std::allocator<int>_> solution_stateIDs_V;
  MDPConfig MDPCfg;
  bool envInitialized;
  EnvNAVXYTHETALAT_InitParms params;
  int i;
  uchar *map;
  int x;
  int y;
  uchar costcircum_thresh;
  uchar costinscribed_thresh;
  vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_> motionprimitiveV;
  uchar obsthresh;
  double timetoturn45degsinplace_secs;
  double nominalvel_mpersecs;
  double cellsize_m;
  double goaltheta;
  double goaly;
  double goalx;
  double starttheta;
  double starty;
  double startx;
  int num_thetas;
  int size_y;
  int size_x;
  double halflength;
  double halfwidth;
  sbpl_2Dpt_t pt_m;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> perimeterptsV;
  EnvironmentNAVXYTHETALAT trueenvironment_navxythetalat;
  EnvironmentNAVXYTHETALAT environment_navxythetalat;
  bool bPrintMap;
  bool bPrint;
  double goaltol_theta;
  double goaltol_y;
  double goaltol_x;
  bool bforwardsearch;
  bool bsearchuntilfirstsolution;
  double initialEpsilon;
  double allocated_time_secs_foreachplan;
  undefined4 in_stack_fffffffffffff638;
  int iVar18;
  undefined4 in_stack_fffffffffffff63c;
  double *what_arg;
  undefined4 uVar19;
  EnvironmentNAVXYTHETALAT *in_stack_fffffffffffff640;
  SBPL_Exception *this_02;
  vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_> *this_03;
  value_type *in_stack_fffffffffffff648;
  value_type *__x;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *in_stack_fffffffffffff650;
  vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_> *this_04;
  uint local_8b8;
  uint local_8b4;
  long local_8b0;
  long local_8a0;
  int local_880;
  int local_870;
  uint local_860;
  uint local_85c;
  int local_734;
  uint local_730;
  uint local_72c [3];
  int local_720;
  int local_71c;
  byte local_715;
  uint local_714;
  int local_710;
  int local_70c;
  int local_708;
  int local_704;
  int local_700;
  uint local_6fc;
  uint local_6f8;
  uint local_6f4;
  int local_6f0;
  uint local_6ec;
  byte local_6e5;
  uint local_6e4;
  uint local_6e0;
  uint local_6dc;
  double local_6d8;
  char local_6cd;
  int local_6cc;
  uint local_6c8;
  uint local_6c4;
  int local_6c0;
  byte local_6b9;
  vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> local_6b8;
  sbpl_2Dcell_t local_6a0;
  vector local_698 [24];
  vector<int,_std::allocator<int>_> local_680;
  uint local_664;
  uint local_660;
  uint local_65c;
  FILE *local_658;
  char *local_650;
  sbpl_2Dcell_t local_644;
  int local_63c;
  int local_638;
  int local_634;
  int local_630;
  int local_62c;
  const_reference local_628;
  int local_61c;
  long local_618;
  double local_610;
  double local_608;
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> local_600;
  undefined4 local_5e4;
  ARAPlanner *local_5e0;
  vector<int,_std::allocator<int>_> local_5d8;
  undefined4 local_5c0;
  undefined4 local_5bc;
  undefined8 local_5b8;
  vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_> *pvStack_5b0;
  value_type *local_5a8;
  vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_> *pvStack_5a0;
  double local_598;
  double dStack_590;
  double local_588;
  double dStack_580;
  double local_578;
  double dStack_570;
  double local_568;
  byte local_551;
  int local_550;
  undefined4 uStack_54c;
  vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_> *pvStack_548;
  value_type *local_540;
  vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_> *pvStack_538;
  double local_530;
  double dStack_528;
  double local_520;
  double dStack_518;
  double local_510;
  double dStack_508;
  double local_500;
  int local_4f4;
  vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_> *local_4f0;
  int local_4e4;
  int local_4e0;
  undefined1 local_4da;
  undefined1 local_4d9;
  vector local_4b9;
  double local_4b8;
  double local_4b0;
  double local_4a8;
  double local_4a0;
  double local_498;
  double local_490;
  double local_488;
  vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_> *local_480;
  value_type *local_478;
  int local_46c;
  uint local_468;
  int local_464;
  double local_460;
  double local_458;
  sbpl_2Dpt_t local_450;
  undefined1 local_440 [40];
  EnvironmentNAVXYTHETALAT local_418 [480];
  _IO_FILE local_238 [2];
  byte local_52;
  byte local_51;
  double local_50;
  double local_48;
  double local_40;
  byte local_32;
  byte local_31;
  undefined8 local_30;
  undefined8 local_28;
  byte local_19;
  undefined4 local_8;
  int local_4;
  
  local_32 = in_CL & 1;
  local_28 = 0x4024000000000000;
  local_30 = 0x4008000000000000;
  local_31 = 0;
  local_40 = 0.001;
  local_48 = 0.001;
  local_50 = 0.001;
  local_51 = 0;
  local_52 = 1;
  local_19 = local_32;
  local_8 = in_EDI;
  EnvironmentNAVXYTHETALAT::EnvironmentNAVXYTHETALAT(in_stack_fffffffffffff640);
  EnvironmentNAVXYTHETALAT::EnvironmentNAVXYTHETALAT(in_stack_fffffffffffff640);
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::vector
            ((vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)0x110850);
  sbpl_2Dpt_t::sbpl_2Dpt_t(&local_450);
  local_458 = 0.01;
  local_460 = 0.01;
  local_450.x = -0.01;
  local_450.y = -0.01;
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::push_back
            (in_stack_fffffffffffff650,in_stack_fffffffffffff648);
  local_450.x = local_460;
  local_450.y = -local_458;
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::push_back
            (in_stack_fffffffffffff650,in_stack_fffffffffffff648);
  local_450.x = local_460;
  local_450.y = local_458;
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::push_back
            (in_stack_fffffffffffff650,in_stack_fffffffffffff648);
  local_450.x = -local_460;
  local_450.y = local_458;
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::push_back
            (in_stack_fffffffffffff650,in_stack_fffffffffffff648);
  bVar5 = EnvironmentNAVXYTHETALATTICE::InitializeEnv((char *)local_418);
  if ((bVar5 & 1) == 0) {
    uVar8 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception
              ((SBPL_Exception *)in_stack_fffffffffffff640,
               (char *)CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
    __cxa_throw(uVar8,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  local_464 = -1;
  local_468 = 0xffffffff;
  local_46c = -1;
  local_478 = (value_type *)0xbff0000000000000;
  local_480 = (vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_> *)
              0xbff0000000000000;
  local_488 = -1.0;
  local_490 = -1.0;
  local_498 = -1.0;
  local_4a0 = -1.0;
  local_4a8 = 0.0;
  local_4b0 = 0.0;
  local_4b8 = 0.0;
  local_4b9 = (vector)0x0;
  std::vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>::vector
            ((vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_> *)0x110af4);
  local_4d9 = 0;
  local_4da = 0;
  this_02 = (SBPL_Exception *)&local_490;
  what_arg = &local_488;
  EnvironmentNAVXYTHETALATTICE::GetEnvParms
            ((int *)local_418,&local_464,(int *)&local_468,(double *)&local_46c,(double *)&local_478
             ,(double *)&local_480,what_arg,(double *)this_02,&local_498,&local_4a0,&local_4a8,
             &local_4b0,(uchar *)&local_4b8,&local_4b9);
  local_4d9 = EnvironmentNAVXYTHETALATTICE::GetEnvParameter((char *)local_418);
  local_4da = EnvironmentNAVXYTHETALATTICE::GetEnvParameter((char *)local_418);
  if ((local_52 & 1) != 0) {
    printf("true map:\n");
    for (local_4e0 = 0; local_4e0 < (int)local_468; local_4e0 = local_4e0 + 1) {
      for (local_4e4 = 0; local_4e4 < local_464; local_4e4 = local_4e4 + 1) {
        bVar5 = EnvironmentNAVXYTHETALATTICE::GetMapCost((int)local_418,local_4e4);
        printf("%3d ",(ulong)bVar5);
      }
      printf("\n");
    }
    uVar6 = system("pause");
    printf("System Pause (return=%d)\n",(ulong)uVar6);
  }
  local_4f0 = (vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_> *)
              operator_new__((long)(int)(local_464 * local_468));
  for (local_4f4 = 0; local_4f4 < (int)(local_464 * local_468); local_4f4 = local_4f4 + 1) {
    *(undefined1 *)
     ((long)&(local_4f0->
             super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>).
             _M_impl.super__Vector_impl_data._M_start + (long)local_4f4) = 0;
  }
  printf("start: %f %f %f, goal: %f %f %f\n",local_478,(int)local_480,local_488,SUB84(local_490,0),
         SUB84(local_498,0),SUB84(local_4a0,0));
  bVar5 = EnvironmentNAVXYTHETALATTICE::SetEnvParameter((char *)local_238,0x118dbc);
  if ((bVar5 & 1) == 0) {
    uVar8 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(this_02,(char *)what_arg);
    __cxa_throw(uVar8,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  bVar5 = EnvironmentNAVXYTHETALATTICE::SetEnvParameter((char *)local_238,0x118dd2);
  if ((bVar5 & 1) == 0) {
    uVar8 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(this_02,(char *)what_arg);
    __cxa_throw(uVar8,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  local_540 = local_478;
  pvStack_538 = local_480;
  local_530 = local_488;
  dStack_528 = local_490;
  local_520 = local_498;
  dStack_518 = local_4a0;
  local_510 = local_40;
  dStack_508 = local_48;
  local_500 = local_50;
  pvStack_548 = local_4f0;
  local_550 = local_46c;
  local_568 = local_50;
  local_578 = local_40;
  dStack_570 = local_48;
  local_5b8 = CONCAT44(uStack_54c,local_46c);
  local_588 = local_498;
  dStack_580 = local_4a0;
  local_598 = local_488;
  dStack_590 = local_490;
  local_5a8 = local_478;
  pvStack_5a0 = local_480;
  pvStack_5b0 = local_4f0;
  EVar3._4_4_ = uStack_54c;
  EVar3.numThetas = local_46c;
  EVar3.mapdata = (uchar *)local_4f0;
  EVar3.startx = (double)local_478;
  EVar3.starty = (double)local_480;
  EVar3.starttheta = local_488;
  EVar3.goalx = local_490;
  EVar3.goaly = local_498;
  EVar3.goaltheta = local_4a0;
  EVar3.goaltol_x = local_40;
  EVar3.goaltol_y = local_48;
  EVar3.goaltol_theta = local_50;
  iVar18 = local_46c;
  this_03 = local_4f0;
  __x = local_478;
  this_04 = local_480;
  local_551 = EnvironmentNAVXYTHETALATTICE::InitializeEnv
                        ((int)local_238,local_464,(vector *)(ulong)local_468,local_4a8,local_4b0,
                         local_4b8,(uchar)local_440,(char *)(ulong)(byte)local_4b9,EVar3);
  local_551 = local_551 & 1;
  if (local_551 == 0) {
    uVar8 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception((SBPL_Exception *)this_03,(char *)CONCAT44(uStack_54c,iVar18));
    __cxa_throw(uVar8,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  EnvironmentNAVXYTHETALAT::SetStart((double)local_478,(double)local_480,local_488);
  EnvironmentNAVXYTHETALAT::SetGoal(local_490,local_498,local_4a0);
  bVar5 = EnvironmentNAVXYTHETALATTICE::InitializeMDPCfg((MDPConfig *)local_238);
  if ((bVar5 & 1) == 0) {
    uVar8 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception((SBPL_Exception *)this_03,(char *)CONCAT44(uStack_54c,iVar18));
    __cxa_throw(uVar8,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x111262);
  local_5e0 = (ARAPlanner *)0x0;
  switch(local_8) {
  case 0:
    printf("Initializing ADPlanner...\n");
    this_00 = (ADPlanner *)operator_new(0x98);
    ADPlanner::ADPlanner(this_00,(DiscreteSpaceInformation *)local_238,(bool)(local_32 & 1));
    uVar19 = uStack_54c;
    local_5e0 = (ARAPlanner *)this_00;
    break;
  case 1:
    printf("Initializing ARAPlanner...\n");
    this = (ARAPlanner *)operator_new(0xa0);
    ARAPlanner::ARAPlanner(this,(DiscreteSpaceInformation *)local_238,(bool)(local_32 & 1));
    uVar19 = uStack_54c;
    local_5e0 = this;
    break;
  default:
    printf("Invalid planner type\n");
    uVar19 = uStack_54c;
    break;
  case 3:
    printf("Invalid configuration: xytheta environment does not support rstar planner...\n");
    local_4 = 0;
    local_5e4 = 1;
    goto LAB_00112bb9;
  case 5:
    printf("Initializing anaPlanner...\n");
    this_01 = (anaPlanner *)operator_new(0x48);
    anaPlanner::anaPlanner(this_01,(DiscreteSpaceInformation *)local_238,(bool)(local_32 & 1));
    uVar19 = uStack_54c;
    local_5e0 = (ARAPlanner *)this_01;
  }
  iVar7 = (**(code **)(*(long *)local_5e0 + 0x28))(local_5e0,local_5c0);
  if (iVar7 == 0) {
    uVar8 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception((SBPL_Exception *)this_03,(char *)CONCAT44(uVar19,iVar18));
    __cxa_throw(uVar8,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  iVar7 = (**(code **)(*(long *)local_5e0 + 0x20))(local_5e0,local_5bc);
  if (iVar7 == 0) {
    uVar8 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception((SBPL_Exception *)this_03,(char *)CONCAT44(uVar19,iVar18));
    __cxa_throw(uVar8,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  (**(code **)(*(long *)local_5e0 + 0x90))(local_30);
  (**(code **)(*(long *)local_5e0 + 0x40))(local_5e0,local_31 & 1);
  std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::vector
            ((vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)0x111600);
  local_608 = 0.0;
  local_610 = 0.0;
  local_618 = EnvironmentNAVXYTHETALATTICE::GetEnvNavConfig();
  for (local_61c = 0; iVar7 = local_61c,
      sVar9 = std::vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>::size
                        ((vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
                          *)(local_618 + 0xd8)), iVar7 < (int)sVar9; local_61c = local_61c + 1) {
    local_628 = std::vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>::at
                          (this_03,CONCAT44(uVar19,iVar18));
    local_62c = *(int *)&local_628->endcell;
    local_630 = *(int *)&local_628->field_0x10;
    if (local_608 < (double)(local_62c * local_62c + local_630 * local_630)) {
      poVar10 = std::operator<<((ostream *)&std::cout,"Found a longer motion primitive with dx = ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_62c);
      poVar10 = std::operator<<(poVar10," and dy = ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_630);
      poVar10 = std::operator<<(poVar10," from starttheta = ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,(uint)local_628->starttheta_c);
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      local_608 = (double)(local_62c * local_62c + local_630 * local_630);
    }
  }
  local_610 = sqrt(local_608);
  poVar10 = std::operator<<((ostream *)&std::cout,"Maximum motion primitive length: ");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_610);
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  dVar17 = ceil(local_610);
  local_634 = (int)dVar17;
  for (local_638 = -local_634; local_638 <= local_634; local_638 = local_638 + 1) {
    for (local_63c = -local_634; local_63c <= local_634; local_63c = local_63c + 1) {
      sbpl_2Dcell_t::sbpl_2Dcell_t(&local_644,local_638,local_63c);
      std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::push_back
                ((vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)this_03,
                 (value_type *)CONCAT44(uVar19,iVar18));
    }
  }
  local_650 = "sol.txt";
  local_658 = fopen("sol.txt","w");
  if (local_658 == (FILE *)0x0) {
    uVar8 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception((SBPL_Exception *)this_03,(char *)CONCAT44(uVar19,iVar18));
    __cxa_throw(uVar8,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  if (local_490 < 0.0) {
    local_85c = (int)(local_490 / local_4a8) - 1;
  }
  else {
    local_85c = (uint)(local_490 / local_4a8);
  }
  local_65c = local_85c;
  if (local_498 < 0.0) {
    local_860 = (int)(local_498 / local_4a8) - 1;
  }
  else {
    local_860 = (uint)(local_498 / local_4a8);
  }
  local_660 = local_860;
  local_664 = ContTheta2Disc(local_4a0,local_46c);
  printf("goal_c: %d %d %d\n",(ulong)local_65c,(ulong)local_660,(ulong)local_664);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x111b31);
  std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::vector
            ((vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)0x111b3e);
  sbpl_2Dcell_t::sbpl_2Dcell_t(&local_6a0);
  std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::vector
            ((vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> *)0x111b5a);
  while( true ) {
    bVar2 = true;
    if ((ABS((double)local_478 - local_490) <= local_40) &&
       (bVar2 = true, ABS((double)local_480 - local_498) <= local_48)) {
      bVar2 = local_50 < ABS(local_488 - local_4a0);
    }
    if (!bVar2) break;
    local_6b9 = 0;
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x111c11);
    std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::clear
              ((vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)0x111c1e);
    for (local_6c0 = 0; iVar7 = local_6c0,
        sVar9 = std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::size(&local_600),
        iVar7 < (int)sVar9; local_6c0 = local_6c0 + 1) {
      if ((double)local_478 < 0.0) {
        local_870 = (int)((double)local_478 / local_4a8) + -1;
      }
      else {
        local_870 = (int)((double)local_478 / local_4a8);
      }
      pvVar11 = std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::at
                          ((vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)this_03,
                           CONCAT44(uVar19,iVar18));
      local_6c4 = local_870 + pvVar11->x;
      if ((double)local_480 < 0.0) {
        local_880 = (int)((double)local_480 / local_4a8) + -1;
      }
      else {
        local_880 = (int)((double)local_480 / local_4a8);
      }
      pvVar11 = std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::at
                          ((vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)this_03,
                           CONCAT44(uVar19,iVar18));
      local_6c8 = local_880 + pvVar11->y;
      if ((((-1 < (int)local_6c4) && ((int)local_6c4 < local_464)) && (-1 < (int)local_6c8)) &&
         ((int)local_6c8 < (int)local_468)) {
        local_6cc = local_6c4 + local_6c8 * local_464;
        local_6cd = EnvironmentNAVXYTHETALATTICE::GetMapCost((int)local_418,local_6c4);
        if (*(char *)((long)&(local_4f0->
                             super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
                             )._M_impl.super__Vector_impl_data._M_start + (long)local_6cc) !=
            local_6cd) {
          *(char *)((long)&(local_4f0->
                           super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
                           )._M_impl.super__Vector_impl_data._M_start + (long)local_6cc) = local_6cd
          ;
          EnvironmentNAVXYTHETALATTICE::UpdateCost((int)local_238,local_6c4,(uchar)local_6c8);
          printf("setting cost[%d][%d] to %d\n",(ulong)local_6c4,(ulong)local_6c8,
                 (ulong)*(byte *)((long)&(local_4f0->
                                         super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
                                         )._M_impl.super__Vector_impl_data._M_start +
                                 (long)local_6cc));
          local_6b9 = 1;
          local_6a0.x = local_6c4;
          local_6a0.y = local_6c8;
          std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::push_back
                    ((vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)this_04,__x);
        }
      }
    }
    cVar12 = clock();
    local_6d8 = (double)cVar12;
    if ((local_6b9 & 1) != 0) {
      if (local_5e0 == (ARAPlanner *)0x0) {
        local_8a0 = 0;
      }
      else {
        local_8a0 = __dynamic_cast(local_5e0,&SBPLPlanner::typeinfo,&ARAPlanner::typeinfo,0);
      }
      if (local_8a0 == 0) {
        if (local_5e0 == (ARAPlanner *)0x0) {
          local_8b0 = 0;
        }
        else {
          local_8b0 = __dynamic_cast(local_5e0,&SBPLPlanner::typeinfo,&ADPlanner::typeinfo,0);
        }
        if (local_8b0 != 0) {
          EnvironmentNAVXYTHETALAT::GetPredsofChangedEdges((vector *)local_238,local_698);
          (**(code **)(*(long *)local_5e0 + 0xb0))(local_5e0,&local_680);
          sVar9 = std::vector<int,_std::allocator<int>_>::size(&local_680);
          printf("%d states were affected\n",sVar9 & 0xffffffff);
        }
      }
      else {
        (**(code **)(*(long *)local_5e0 + 0xa8))();
      }
    }
    if ((double)local_478 < 0.0) {
      local_8b4 = (int)((double)local_478 / local_4a8) - 1;
    }
    else {
      local_8b4 = (uint)((double)local_478 / local_4a8);
    }
    local_6dc = local_8b4;
    if ((double)local_480 < 0.0) {
      local_8b8 = (int)((double)local_480 / local_4a8) - 1;
    }
    else {
      local_8b8 = (uint)((double)local_480 / local_4a8);
    }
    local_6e0 = local_8b8;
    local_6e4 = ContTheta2Disc(local_488,local_46c);
    local_6e5 = 0;
    printf("new planning...\n");
    iVar7 = (*(code *)**(undefined8 **)local_5e0)(local_28,local_5e0,&local_5d8);
    local_6e5 = iVar7 == 1;
    sVar9 = std::vector<int,_std::allocator<int>_>::size(&local_5d8);
    uVar8 = (**(code **)(*(long *)local_5e0 + 0x50))();
    printf("done with the solution of size=%d and sol. eps=%f\n",uVar8,sVar9 & 0xffffffff);
    EnvironmentNAVXYTHETALATTICE::PrintTimeStat(local_238);
    pFVar4 = local_658;
    cVar12 = clock();
    dVar17 = (double)cVar12 - local_6d8;
    uVar16 = (**(code **)(*(long *)local_5e0 + 0x50))();
    fprintf(pFVar4,"plan time=%.5f eps=%.2f\n",dVar17 / 1000000.0,uVar16);
    fflush(local_658);
    std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::clear
              ((vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> *)0x1122d2);
    EnvironmentNAVXYTHETALAT::ConvertStateIDPathintoXYThetaPath
              ((vector *)local_238,(vector *)&local_5d8);
    sVar9 = std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::size(&local_6b8);
    printf("actual path (with intermediate poses) size=%d\n",sVar9 & 0xffffffff);
    for (local_6ec = 0; uVar13 = (ulong)local_6ec,
        sVar9 = std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::size
                          (&local_6b8), pFVar4 = local_658, uVar13 < sVar9;
        local_6ec = local_6ec + 1) {
      pvVar14 = std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::at
                          ((vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> *)
                           this_03,CONCAT44(uVar19,iVar18));
      uVar8 = *(undefined8 *)pvVar14;
      pvVar14 = std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::at
                          ((vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> *)
                           this_03,CONCAT44(uVar19,iVar18));
      uVar1 = *(undefined8 *)(pvVar14 + 8);
      pvVar14 = std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::at
                          ((vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> *)
                           this_03,CONCAT44(uVar19,iVar18));
      fprintf(pFVar4,"%.3f %.3f %.3f\n",uVar8,(int)uVar1,*(undefined8 *)(pvVar14 + 0x10));
    }
    fprintf(local_658,"*********\n");
    for (local_6f0 = 1; iVar7 = local_6f0,
        sVar9 = std::vector<int,_std::allocator<int>_>::size(&local_5d8), iVar7 < (int)sVar9;
        local_6f0 = local_6f0 + 1) {
      local_6fc = 0;
      puVar15 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                  (&local_5d8,(long)local_6f0);
      EnvironmentNAVXYTHETALAT::GetCoordFromState
                ((int)local_238,(int *)(ulong)*puVar15,(int *)&local_6f4,(int *)&local_6f8);
      fprintf(local_658,"%d %d %d\n",(ulong)local_6f4,(ulong)local_6f8,(ulong)local_6fc);
    }
    fflush(local_658);
    local_700 = local_6dc + local_6e0 * local_464;
    local_704 = local_65c + local_660 * local_464;
    for (local_708 = 0; (local_52 & 1) != 0 && local_708 < (int)local_468; local_708 = local_708 + 1
        ) {
      for (local_70c = 0; local_70c < local_464; local_70c = local_70c + 1) {
        local_710 = local_70c + local_708 * local_464;
        local_714 = (uint)*(byte *)((long)&(local_4f0->
                                           super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
                                           )._M_impl.super__Vector_impl_data._M_start +
                                   (long)local_710);
        bVar5 = EnvironmentNAVXYTHETALATTICE::GetMapCost((int)local_238,local_70c);
        local_714 = (uint)bVar5;
        local_715 = 0;
        for (local_71c = 1; iVar7 = local_71c,
            sVar9 = std::vector<int,_std::allocator<int>_>::size(&local_5d8), iVar7 < (int)sVar9;
            local_71c = local_71c + 1) {
          local_72c[1] = 0;
          puVar15 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                      (&local_5d8,(long)local_71c);
          EnvironmentNAVXYTHETALAT::GetCoordFromState
                    ((int)local_238,(int *)(ulong)*puVar15,&local_720,(int *)(local_72c + 2));
          if ((local_70c == local_720) && (local_708 == local_72c[2])) {
            local_715 = 1;
          }
        }
        if (((local_710 == local_700) || (local_710 == local_704)) || ((local_715 & 1) != 0)) {
          if (local_710 == local_700) {
            printf("  X ");
          }
          else if (local_710 == local_704) {
            printf("  G ");
          }
          else if ((local_715 & 1) == 0) {
            printf("? ");
          }
          else {
            printf("  * ");
          }
        }
        else {
          printf("%3d ",(ulong)local_714);
        }
      }
      printf("\n");
    }
    if (((local_6e5 & 1) == 0) ||
       (sVar9 = std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::size
                          (&local_6b8), (int)sVar9 < 2)) {
      printf("No move is made\n");
    }
    else {
      puVar15 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](&local_5d8,1);
      EnvironmentNAVXYTHETALAT::GetCoordFromState
                ((int)local_238,(int *)(ulong)*puVar15,(int *)local_72c,(int *)&local_730);
      iVar18 = local_734;
      printf("moving from %d %d %d to %d %d %d\n",(ulong)local_6dc,(ulong)local_6e0,(ulong)local_6e4
             ,(ulong)local_72c[0],(ulong)local_730);
      bVar5 = EnvironmentNAVXYTHETALATTICE::IsValidConfiguration
                        ((int)local_418,local_72c[0],local_730);
      if ((bVar5 & 1) == 0) {
        uVar8 = __cxa_allocate_exception(0x10);
        SBPL_Exception::SBPL_Exception((SBPL_Exception *)this_03,(char *)CONCAT44(uVar19,iVar18));
        __cxa_throw(uVar8,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
      }
      local_478 = (value_type *)((double)(int)local_72c[0] * local_4a8 + local_4a8 * 0.5);
      local_480 = (vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_> *)
                  ((double)(int)local_730 * local_4a8 + local_4a8 * 0.5);
      local_488 = (double)DiscTheta2Cont(local_734,local_46c);
      uVar16 = EnvironmentNAVXYTHETALAT::SetStart((double)local_478,(double)local_480,local_488);
      iVar7 = (**(code **)(*(long *)local_5e0 + 0x28))(local_5e0,uVar16);
      if (iVar7 == 0) {
        uVar8 = __cxa_allocate_exception(0x10);
        SBPL_Exception::SBPL_Exception((SBPL_Exception *)this_03,(char *)CONCAT44(uVar19,iVar18));
        __cxa_throw(uVar8,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
      }
    }
    if ((local_51 & 1) != 0) {
      uVar6 = system("pause");
      printf("System Pause (return=%d)\n",(ulong)uVar6);
    }
  }
  printf("goal reached!\n");
  fflush((FILE *)0x0);
  fclose(local_658);
  if (local_4f0 != (vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_> *)0x0)
  {
    operator_delete__(local_4f0);
  }
  if (local_5e0 != (ARAPlanner *)0x0) {
    (**(code **)(*(long *)local_5e0 + 0xa0))();
  }
  local_4 = 1;
  local_5e4 = 1;
  std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::~vector
            ((vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> *)this_04);
  std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::~vector
            ((vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)this_04);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_04);
  std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::~vector
            ((vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)this_04);
LAB_00112bb9:
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_04);
  std::vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>::~vector(this_04);
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::~vector
            ((vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)this_04);
  EnvironmentNAVXYTHETALAT::~EnvironmentNAVXYTHETALAT(local_418);
  EnvironmentNAVXYTHETALAT::~EnvironmentNAVXYTHETALAT((EnvironmentNAVXYTHETALAT *)local_238);
  return local_4;
}

Assistant:

int planandnavigatexythetalat(PlannerType plannerType, char* envCfgFilename, char* motPrimFilename, bool forwardSearch)
{
    double allocated_time_secs_foreachplan = 10.0; // in seconds
    double initialEpsilon = 3.0;
    bool bsearchuntilfirstsolution = false;
    bool bforwardsearch = forwardSearch;

    double goaltol_x = 0.001, goaltol_y = 0.001, goaltol_theta = 0.001;

    bool bPrint = false;
    bool bPrintMap = true;

    EnvironmentNAVXYTHETALAT environment_navxythetalat;
    EnvironmentNAVXYTHETALAT trueenvironment_navxythetalat;

    // set the perimeter of the robot
    // it is given with 0, 0, 0 robot ref. point for which planning is done.
    vector<sbpl_2Dpt_t> perimeterptsV;
    sbpl_2Dpt_t pt_m;
    double halfwidth = 0.01;
    double halflength = 0.01;
    pt_m.x = -halflength;
    pt_m.y = -halfwidth;
    perimeterptsV.push_back(pt_m);
    pt_m.x = halflength;
    pt_m.y = -halfwidth;
    perimeterptsV.push_back(pt_m);
    pt_m.x = halflength;
    pt_m.y = halfwidth;
    perimeterptsV.push_back(pt_m);
    pt_m.x = -halflength;
    pt_m.y = halfwidth;
    perimeterptsV.push_back(pt_m);

    //	perimeterptsV.clear();

    // initialize true map from the environment file without perimeter or motion primitives
    if (!trueenvironment_navxythetalat.InitializeEnv(envCfgFilename)) {
        throw SBPL_Exception("ERROR: InitializeEnv failed");
    }

    // environment parameters
    int size_x = -1, size_y = -1, num_thetas = -1;
    double startx = -1, starty = -1, starttheta = -1;
    double goalx = -1, goaly = -1, goaltheta = -1;
    double cellsize_m = 0.0, nominalvel_mpersecs = 0.0, timetoturn45degsinplace_secs = 0.0;
    unsigned char obsthresh = 0;
    vector<SBPL_xytheta_mprimitive> motionprimitiveV;

    // additional environment parameters
    unsigned char costinscribed_thresh = 0;
    unsigned char costcircum_thresh = 0;

    // get environment parameters from the true environment
    trueenvironment_navxythetalat.GetEnvParms(&size_x, &size_y, &num_thetas, &startx, &starty, &starttheta, &goalx,
                                              &goaly, &goaltheta, &cellsize_m, &nominalvel_mpersecs,
                                              &timetoturn45degsinplace_secs, &obsthresh, &motionprimitiveV);
    costinscribed_thresh = trueenvironment_navxythetalat.GetEnvParameter("cost_inscribed_thresh");
    costcircum_thresh = trueenvironment_navxythetalat.GetEnvParameter("cost_possibly_circumscribed_thresh");

    // print the map
    if (bPrintMap) {
        printf("true map:\n");
        for (int y = 0; y < size_y; y++) {
            for (int x = 0; x < size_x; x++) {
                printf("%3d ", trueenvironment_navxythetalat.GetMapCost(x, y));
            }
            printf("\n");
        }
        printf("System Pause (return=%d)\n", system("pause"));
    }

    // create an empty map
    unsigned char* map = new unsigned char[size_x * size_y];
    for (int i = 0; i < size_x * size_y; i++) {
        map[i] = 0;
    }

    // check the start and goal obtained from the true environment
    printf("start: %f %f %f, goal: %f %f %f\n", startx, starty, starttheta, goalx, goaly, goaltheta);

    // set robot environment parameters (should be done before initialize function is called)
    if (!environment_navxythetalat.SetEnvParameter("cost_inscribed_thresh", costinscribed_thresh)) {
        throw SBPL_Exception("ERROR: failed to set parameters");
    }
    if (!environment_navxythetalat.SetEnvParameter("cost_possibly_circumscribed_thresh", costcircum_thresh)) {
        throw SBPL_Exception("ERROR: failed to set parameters");
    }

    // initialize environment (should be called before initializing anything else)
    EnvNAVXYTHETALAT_InitParms params;
    params.startx = startx;
    params.starty = starty;
    params.starttheta = starttheta;
    params.goalx = goalx;
    params.goaly = goaly;
    params.goaltheta = goaltheta;
    params.goaltol_x = goaltol_x;
    params.goaltol_y = goaltol_y;
    params.goaltol_theta = goaltol_theta;
    params.mapdata = map;
    params.numThetas = num_thetas;

    bool envInitialized = environment_navxythetalat.InitializeEnv(size_x, size_y, perimeterptsV, cellsize_m,
                                                                  nominalvel_mpersecs, timetoturn45degsinplace_secs,
                                                                  obsthresh, motPrimFilename, params);

    if (!envInitialized) {
        throw SBPL_Exception("ERROR: InitializeEnv failed");
    }

    // set start and goal states
    environment_navxythetalat.SetStart(startx, starty, starttheta);
    environment_navxythetalat.SetGoal(goalx, goaly, goaltheta);

    MDPConfig MDPCfg;

    // initialize MDP info
    if (!environment_navxythetalat.InitializeMDPCfg(&MDPCfg)) {
        throw SBPL_Exception("ERROR: InitializeMDPCfg failed");
    }

    // create a planner
    vector<int> solution_stateIDs_V;

    SBPLPlanner* planner = NULL;
    switch (plannerType) {
    case PLANNER_TYPE_ARASTAR:
        printf("Initializing ARAPlanner...\n");
        planner = new ARAPlanner(&environment_navxythetalat, bforwardsearch);
        break;
    case PLANNER_TYPE_ADSTAR:
        printf("Initializing ADPlanner...\n");
        planner = new ADPlanner(&environment_navxythetalat, bforwardsearch);
        break;
    case PLANNER_TYPE_RSTAR:
        printf("Invalid configuration: xytheta environment does not support rstar planner...\n");
        return 0;
    case PLANNER_TYPE_ANASTAR:
        printf("Initializing anaPlanner...\n");
        planner = new anaPlanner(&environment_navxythetalat, bforwardsearch);
        break;
    default:
        printf("Invalid planner type\n");
        break;
    }

    // set the start and goal states for the planner and other search variables
    if (planner->set_start(MDPCfg.startstateid) == 0) {
        throw SBPL_Exception("ERROR: failed to set start state");
    }
    if (planner->set_goal(MDPCfg.goalstateid) == 0) {
        throw SBPL_Exception("ERROR: failed to set goal state");
    }
    planner->set_initialsolution_eps(initialEpsilon);
    planner->set_search_mode(bsearchuntilfirstsolution);

    // compute sensing as a square surrounding the robot with length twice that of the
    // longest motion primitive
    vector<sbpl_2Dcell_t> sensecells;
    double maxMotPrimLengthSquared = 0.0;
    double maxMotPrimLength = 0.0;
    const EnvNAVXYTHETALATConfig_t* cfg = environment_navxythetalat.GetEnvNavConfig();
    for (int i = 0; i < (int)cfg->mprimV.size(); i++) {
        const SBPL_xytheta_mprimitive& mprim = cfg->mprimV.at(i);
        int dx = mprim.endcell.x;
        int dy = mprim.endcell.y;
        if (dx * dx + dy * dy > maxMotPrimLengthSquared) {
            std::cout << "Found a longer motion primitive with dx = " << dx << " and dy = " << dy
                << " from starttheta = " << (int)mprim.starttheta_c << std::endl;
            maxMotPrimLengthSquared = dx * dx + dy * dy;
        }
    }
    maxMotPrimLength = sqrt((double)maxMotPrimLengthSquared);
    std::cout << "Maximum motion primitive length: " << maxMotPrimLength << std::endl;

    int sensingRange = (int)ceil(maxMotPrimLength);
    for (int x = -sensingRange; x <= sensingRange; x++) {
        for (int y = -sensingRange; y <= sensingRange; y++) {
            sensecells.push_back(sbpl_2Dcell_t(x, y));
        }
    }

    // create a file to hold the solution vector
    const char* sol = "sol.txt";
    FILE* fSol = fopen(sol, "w");
    if (fSol == NULL) {
        throw SBPL_Exception("ERROR: could not open solution file");
    }

    // print the goal pose
    int goalx_c = CONTXY2DISC(goalx, cellsize_m);
    int goaly_c = CONTXY2DISC(goaly, cellsize_m);
    int goaltheta_c = ContTheta2Disc(goaltheta, num_thetas);
    printf("goal_c: %d %d %d\n", goalx_c, goaly_c, goaltheta_c);

    vector<int> preds_of_changededgesIDV;
    vector<nav2dcell_t> changedcellsV;
    nav2dcell_t nav2dcell;
    vector<sbpl_xy_theta_pt_t> xythetaPath;

    // now comes the main loop
    while (fabs(startx - goalx) > goaltol_x || fabs(starty - goaly) > goaltol_y || fabs(starttheta - goaltheta)
        > goaltol_theta) {
        //simulate sensor data update
        bool bChanges = false;
        preds_of_changededgesIDV.clear();
        changedcellsV.clear();

        // simulate sensing the cells
        for (int i = 0; i < (int)sensecells.size(); i++) {
            int x = CONTXY2DISC(startx, cellsize_m) + sensecells.at(i).x;
            int y = CONTXY2DISC(starty, cellsize_m) + sensecells.at(i).y;

            // ignore if outside the map
            if (x < 0 || x >= size_x || y < 0 || y >= size_y) {
                continue;
            }

            int index = x + y * size_x;
            unsigned char truecost = trueenvironment_navxythetalat.GetMapCost(x, y);
            // update the cell if we haven't seen it before
            if (map[index] != truecost) {
                map[index] = truecost;
                environment_navxythetalat.UpdateCost(x, y, map[index]);
                printf("setting cost[%d][%d] to %d\n", x, y, map[index]);
                bChanges = true;
                // store the changed cells
                nav2dcell.x = x;
                nav2dcell.y = y;
                changedcellsV.push_back(nav2dcell);
            }
        }

        double TimeStarted = clock();

        // if necessary notify the planner of changes to costmap
        if (bChanges) {
            if (dynamic_cast<ARAPlanner*> (planner) != NULL) {
                ((ARAPlanner*)planner)->costs_changed(); //use by ARA* planner (non-incremental)
            }
            else if (dynamic_cast<ADPlanner*> (planner) != NULL) {
                // get the affected states
                environment_navxythetalat.GetPredsofChangedEdges(&changedcellsV, &preds_of_changededgesIDV);
                // let know the incremental planner about them
                //use by AD* planner (incremental)
                ((ADPlanner*)planner)->update_preds_of_changededges(&preds_of_changededgesIDV);
                printf("%d states were affected\n", (int)preds_of_changededgesIDV.size());
            }
        }

        int startx_c = CONTXY2DISC(startx, cellsize_m);
        int starty_c = CONTXY2DISC(starty, cellsize_m);
        int starttheta_c = ContTheta2Disc(starttheta, num_thetas);

        // plan a path
        bool bPlanExists = false;

        printf("new planning...\n");
        bPlanExists = (planner->replan(allocated_time_secs_foreachplan, &solution_stateIDs_V) == 1);
        printf("done with the solution of size=%d and sol. eps=%f\n", (unsigned int)solution_stateIDs_V.size(),
               planner->get_solution_eps());
        environment_navxythetalat.PrintTimeStat(stdout);

        // write the solution to sol.txt
        fprintf(fSol, "plan time=%.5f eps=%.2f\n", (clock() - TimeStarted) / ((double)CLOCKS_PER_SEC),
                planner->get_solution_eps());
        fflush(fSol);

        xythetaPath.clear();
        environment_navxythetalat.ConvertStateIDPathintoXYThetaPath(&solution_stateIDs_V, &xythetaPath);
        printf("actual path (with intermediate poses) size=%d\n", (unsigned int)xythetaPath.size());
        for (unsigned int i = 0; i < xythetaPath.size(); i++) {
            fprintf(fSol, "%.3f %.3f %.3f\n", xythetaPath.at(i).x, xythetaPath.at(i).y, xythetaPath.at(i).theta);
        }
        fprintf(fSol, "*********\n");

        for (int j = 1; j < (int)solution_stateIDs_V.size(); j++) {
            int newx, newy, newtheta = 0;
            environment_navxythetalat.GetCoordFromState(solution_stateIDs_V[j], newx, newy, newtheta);
            fprintf(fSol, "%d %d %d\n", newx, newy, newtheta);
        }
        fflush(fSol);

        // print the map (robot's view of the world and current plan)
        int startindex = startx_c + starty_c * size_x;
        int goalindex = goalx_c + goaly_c * size_x;
        for (int y = 0; bPrintMap && y < size_y; y++) {
            for (int x = 0; x < size_x; x++) {
                int index = x + y * size_x;
                int cost = map[index];
                cost = environment_navxythetalat.GetMapCost(x, y);

                // check to see if it is on the path
                bool bOnthePath = false;
                for (int j = 1; j < (int)solution_stateIDs_V.size(); j++) {
                    int newx, newy, newtheta = 0;
                    environment_navxythetalat.GetCoordFromState(solution_stateIDs_V[j], newx, newy, newtheta);
                    if (x == newx && y == newy) bOnthePath = true;
                }

                if (index != startindex && index != goalindex && !bOnthePath) {
                    printf("%3d ", cost);
                }
                else if (index == startindex) {
                    printf("  X ");
                }
                else if (index == goalindex) {
                    printf("  G ");
                }
                else if (bOnthePath) {
                    printf("  * ");
                }
                else {
                    printf("? ");
                }
            }
            printf("\n");
        }

        // move along the path
        if (bPlanExists && (int)xythetaPath.size() > 1) {
            //get coord of the successor
            int newx, newy, newtheta;

            // move until we move into the end of motion primitive
            environment_navxythetalat.GetCoordFromState(solution_stateIDs_V[1], newx, newy, newtheta);

            printf("moving from %d %d %d to %d %d %d\n", startx_c, starty_c, starttheta_c, newx, newy, newtheta);

            // this check is weak since true configuration does not know the actual perimeter of the robot
            if (!trueenvironment_navxythetalat.IsValidConfiguration(newx, newy, newtheta)) {
                throw SBPL_Exception("ERROR: robot is commanded to move into an invalid configuration according to true environment");
            }

            // move
            startx = DISCXY2CONT(newx, cellsize_m);
            starty = DISCXY2CONT(newy, cellsize_m);
            starttheta = DiscTheta2Cont(newtheta, num_thetas);

            // update the environment
            int newstartstateID = environment_navxythetalat.SetStart(startx, starty, starttheta);

            // update the planner
            if (planner->set_start(newstartstateID) == 0) {
                throw SBPL_Exception("ERROR: failed to update robot pose in the planner");
            }
        }
        else {
            printf("No move is made\n");
        }

        if (bPrint) {
            printf("System Pause (return=%d)\n", system("pause"));
        }
    }

    printf("goal reached!\n");

    fflush(NULL);
    fclose(fSol);

    delete[] map;
    delete planner;

    return 1;
}